

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdsystem.cpp
# Opt level: O2

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  for (lVar3 = 0x18; lVar3 != 0xf8; lVar3 = lVar3 + 0x20) {
    uVar1 = *(undefined8 *)((long)&stringlib_funcs[9].f + lVar3);
    uVar2 = *(undefined8 *)((long)&stringlib_funcs[9].nparamscheck + lVar3);
    sq_pushstring(v,uVar1,0xffffffffffffffff);
    sq_newclosure(v,uVar2,0);
    sq_setparamscheck(v,*(undefined8 *)((long)&stringlib_funcs[9].typemask + lVar3),
                      *(undefined8 *)((long)&systemlib_funcs[0].name + lVar3));
    sq_setnativeclosurename(v,0xffffffffffffffff,uVar1);
    sq_newslot(v,0xfffffffffffffffd,0);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(systemlib_funcs[i].name!=0)
    {
        sq_pushstring(v,systemlib_funcs[i].name,-1);
        sq_newclosure(v,systemlib_funcs[i].f,0);
        sq_setparamscheck(v,systemlib_funcs[i].nparamscheck,systemlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,systemlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}